

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberDeclaration_Field.cpp
# Opt level: O0

ostream * psy::C::operator<<(ostream *os,FieldDeclarationSymbol *fld)

{
  ostream *poVar1;
  Lexeme *this;
  Type *ty;
  string local_40;
  MemberDeclarationSymbol *local_20;
  FieldDeclarationSymbol *fld_local;
  ostream *os_local;
  
  local_20 = &fld->super_MemberDeclarationSymbol;
  fld_local = (FieldDeclarationSymbol *)os;
  if (fld == (FieldDeclarationSymbol *)0x0) {
    os_local = std::operator<<(os,"<Field is null>");
  }
  else {
    std::operator<<(os,"<Field |");
    poVar1 = std::operator<<((ostream *)fld_local," name:");
    this = &MemberDeclarationSymbol::name(local_20)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_40,this);
    std::operator<<(poVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    poVar1 = std::operator<<((ostream *)fld_local," type:");
    ty = MemberDeclarationSymbol::type(local_20);
    operator<<(poVar1,ty);
    std::operator<<((ostream *)fld_local,">");
    os_local = (ostream *)fld_local;
  }
  return os_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const FieldDeclarationSymbol* fld)
{
    if (!fld)
        return os << "<Field is null>";
    os << "<Field |";
    os << " name:" << fld->name()->valueText();
    os << " type:" << fld->type();
    os << ">";
    return os;
}